

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTables.h
# Opt level: O2

void __thiscall CTables::calcInterpolationTableInt(CTables *this)

{
  undefined1 auVar1 [16];
  interpItemInt **ppiVar2;
  ulong uVar3;
  interpItemInt *piVar4;
  ostream *poVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  
  iVar13 = this->cellSize;
  uVar14 = (ulong)iVar13;
  uVar3 = uVar14 * 8;
  if ((long)uVar14 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppiVar2 = (interpItemInt **)operator_new__(uVar3);
  this->interpolationTableInt = ppiVar2;
  uVar3 = (long)iVar13 / -2 & 0xffffffff;
  do {
    uVar7 = (int)uVar14 >> 0x1f;
    uVar10 = (uint)uVar3;
    iVar13 = (int)((long)((ulong)uVar7 << 0x20 | uVar14 & 0xffffffff) / 2);
    if (iVar13 <= (int)uVar10) {
      poVar5 = std::operator<<((ostream *)&std::cout,"interTable created");
      std::endl<char,std::char_traits<char>>(poVar5);
      return;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)uVar14;
    uVar3 = SUB168(auVar1 * ZEXT816(0x30),0);
    if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    piVar4 = (interpItemInt *)operator_new__(uVar3);
    this->interpolationTableInt[(int)(iVar13 + uVar10)] = piVar4;
    uVar3 = (long)((ulong)uVar7 << 0x20 | uVar14 & 0xffffffff) / -2 & 0xffffffff;
    uVar7 = uVar10 + 1;
    ppiVar2 = this->interpolationTableInt;
    uVar8 = ~uVar10;
    while( true ) {
      iVar11 = (int)uVar14;
      uVar6 = (uint)uVar3;
      iVar13 = (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) / 2);
      if (iVar13 <= (int)uVar6) break;
      if ((int)(uVar6 & uVar10) < 0) {
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[0][0] = 0;
        iVar9 = iVar11 + uVar6 + 1;
        iVar13 = this->cellSize / 2;
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[0][1] = 0;
        iVar13 = this->cellSize / 2;
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[0] =
             iVar9 * (uVar7 + iVar11);
        iVar13 = this->cellSize / 2;
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[1][0] = 0;
        iVar13 = this->cellSize / 2;
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[1][1] = -1;
        uVar12 = iVar11 - iVar9;
        iVar13 = this->cellSize / 2;
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[1] = iVar9 * uVar8;
        iVar13 = this->cellSize / 2;
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[2][0] = -1;
        iVar13 = this->cellSize / 2;
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[2][1] = 0;
        iVar13 = this->cellSize / 2;
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[2] =
             (uVar7 + iVar11) * uVar12;
        iVar13 = this->cellSize / 2;
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[3][0] = -1;
        iVar13 = this->cellSize / 2;
        ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[3][1] = -1;
LAB_00103968:
        iVar13 = uVar12 * uVar8;
      }
      else {
        if (((int)uVar10 < 0) && (-1 < (int)uVar6)) {
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[0][0] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[0][1] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[0] =
               (iVar11 - uVar6) * (uVar7 + iVar11);
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[1][0] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[1][1] = -1;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[1] =
               (iVar11 - uVar6) * uVar8;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[2][0] = 1;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[2][1] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[2] =
               (uVar7 + iVar11) * uVar6;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[3][0] = 1;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[3][1] = -1;
          uVar12 = uVar6;
          goto LAB_00103968;
        }
        if ((int)(uVar6 | uVar10) < 0) {
          if (((int)uVar10 < 0) || (-1 < (int)uVar6)) {
            poVar5 = std::operator<<((ostream *)&std::cout,"err");
            std::endl<char,std::char_traits<char>>(poVar5);
            exit(0);
          }
          iVar9 = iVar11 + uVar6 + 1;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[0][0] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[0][1] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[0] =
               iVar9 * (iVar11 - uVar10);
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[1][0] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[1][1] = 1;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[1] = iVar9 * uVar10;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[2][0] = -1;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[2][1] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[2] =
               (iVar11 - uVar10) * (iVar11 - iVar9);
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[3][0] = -1;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[3][1] = 1;
          iVar13 = (iVar11 - iVar9) * uVar10;
        }
        else {
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[0][0] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[0][1] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[0] =
               (iVar11 - uVar6) * (iVar11 - uVar10);
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[1][0] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[1][1] = 1;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[1] =
               (iVar11 - uVar6) * uVar10;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[2][0] = 1;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[2][1] = 0;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].weightRatio[2] =
               (iVar11 - uVar10) * uVar6;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[3][0] = 1;
          iVar13 = this->cellSize / 2;
          ppiVar2[(int)(iVar13 + uVar10)][(int)(iVar13 + uVar6)].displace[3][1] = 1;
          iVar13 = uVar6 * uVar10;
        }
      }
      iVar11 = this->cellSize / 2;
      ppiVar2[(int)(iVar11 + uVar10)][(int)(iVar11 + uVar6)].weightRatio[3] = iVar13;
      uVar3 = (ulong)(uVar6 + 1);
      uVar14 = (ulong)(uint)this->cellSize;
    }
    uVar3 = (ulong)uVar7;
  } while( true );
}

Assistant:

void CTables::calcInterpolationTableInt()
{
    interpolationTableInt = new interpItemInt*[cellSize];
    for(int y=-cellSize/2; y<cellSize/2; y++)
    {
        interpolationTableInt[y+cellSize/2] = new interpItemInt[cellSize];
        for(int x=-cellSize/2; x<cellSize/2; x++)
        {
            if(y<0 && x <0)
            {
                int nearWeightX = cellSize + x + 1;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize + y + 1;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y<0 && x>=0)
            {
                int nearWeightX = cellSize - x;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize + y + 1;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y>=0 && x>=0)
            {
                int nearWeightX = cellSize - x;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize - y;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y>=0 && x<0)
            {
                int nearWeightX = cellSize + x + 1;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize - y;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else
            {
                cout<<"err"<<endl;
                exit(0);
            }
        }
    }
    cout<<"interTable created"<<endl;
}